

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::WriteTargetLinkDependRules(cmMakefileTargetGenerator *this)

{
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  string local_f8;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  _Base_ptr local_90;
  undefined1 local_88;
  string local_80;
  undefined1 local_60 [8];
  string depFile;
  string local_30;
  cmMakefileTargetGenerator *local_10;
  cmMakefileTargetGenerator *this_local;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  local_10 = this;
  GetConfigName_abi_cxx11_(&local_30,this);
  bVar3 = cmGeneratorTarget::HasLinkDependencyFile(pcVar1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    pcVar2 = this->LocalGenerator;
    GetConfigName_abi_cxx11_(&local_80,this);
    (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[0xb])(local_60,pcVar2,pcVar1,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->CleanFiles,(value_type *)local_60);
    local_90 = (_Base_ptr)pVar4.first._M_node;
    local_88 = pVar4.second;
    pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    pcVar2 = this->LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"LINK",&local_b1);
    this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    GetConfigName_abi_cxx11_(&local_f8,this);
    cmGeneratorTarget::GetFullPath(&local_d8,this_00,&local_f8,RuntimeBinaryArtifact,false);
    cmLocalUnixMakefileGenerator3::AddImplicitDepends
              (pcVar2,pcVar1,&local_b0,&local_d8,(string *)local_60,Compiler);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetLinkDependRules()
{
  if (!this->GeneratorTarget->HasLinkDependencyFile(this->GetConfigName())) {
    return;
  }

  auto depFile = this->LocalGenerator->GetLinkDependencyFile(
    this->GeneratorTarget, this->GetConfigName());
  this->CleanFiles.insert(depFile);
  this->LocalGenerator->AddImplicitDepends(
    this->GeneratorTarget, "LINK",
    this->GeneratorTarget->GetFullPath(this->GetConfigName()), depFile,
    cmDependencyScannerKind::Compiler);
}